

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O3

void __thiscall
CVmObjGramProd::insert_alt(CVmObjGramProd *this,vm_obj_id_t self,size_t idx,vmgram_alt_info *alt)

{
  byte *pbVar1;
  long lVar2;
  ulong uVar3;
  char *pcVar4;
  
  ensure_alts(this,*(long *)((this->super_CVmObject).ext_ + 0x38) + 1,8);
  pcVar4 = (this->super_CVmObject).ext_;
  lVar2 = *(long *)(pcVar4 + 0x30);
  uVar3 = *(ulong *)(pcVar4 + 0x38);
  if (idx < uVar3) {
    do {
      *(undefined8 *)(lVar2 + uVar3 * 8) = *(undefined8 *)(lVar2 + -8 + uVar3 * 8);
      uVar3 = uVar3 - 1;
    } while (idx < uVar3);
    pcVar4 = (this->super_CVmObject).ext_;
    uVar3 = *(ulong *)(pcVar4 + 0x38);
  }
  *(ulong *)(pcVar4 + 0x38) = uVar3 + 1;
  *(vmgram_alt_info **)(lVar2 + idx * 8) = alt;
  pbVar1 = (byte *)((this->super_CVmObject).ext_ + 0x14);
  *pbVar1 = *pbVar1 | 1;
  if (((alt->tok_cnt != 0) && (alt->toks->typ == '\x01')) && ((alt->toks->typinfo).prod_obj == self)
     ) {
    pbVar1 = (byte *)((this->super_CVmObject).ext_ + 0x14);
    *pbVar1 = *pbVar1 | 4;
  }
  return;
}

Assistant:

void CVmObjGramProd::insert_alt(
    vm_obj_id_t self, size_t idx, vmgram_alt_info *alt)
{
    /* make sure we have room for one more alternative */
    ensure_alts(get_ext()->alt_cnt_ + 1, 8);

    /* get the alt list */
    vmgram_alt_info **alts = get_ext()->alts_;

    /* open a hole in the array for the new alternative */
    for (size_t i = get_ext()->alt_cnt_ ; i > idx ; --i)
        alts[i] = alts[i-1];

    /* adjust the count */
    get_ext()->alt_cnt_ += 1;

    /* plug in the new alternative */
    alts[idx] = alt;

    /* we've been modified since load time */
    get_ext()->modified_ = TRUE;

    /* note if this adds a circular rule */
    if (alt->tok_cnt != 0
        && alt->toks->typ == VMGRAM_MATCH_PROD
        && alt->toks->typinfo.prod_obj == self)
        get_ext()->has_circular_alt = TRUE;
}